

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NNValidatorTests.cpp
# Opt level: O3

int testInvalidEmbeddingBias(void)

{
  RepeatedField<long> *this;
  RepeatedField<float> *this_00;
  uint uVar1;
  Rep *pRVar2;
  ulong uVar3;
  bool bVar4;
  FeatureType *pFVar5;
  long *plVar6;
  FeatureDescription *pFVar7;
  ArrayFeatureType *pAVar8;
  NeuralNetworkLayer *pNVar9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar10;
  void *pvVar11;
  LayerUnion LVar12;
  WeightParams *pWVar13;
  float *pfVar14;
  ostream *poVar15;
  undefined8 *puVar16;
  RepeatedPtrField<CoreML::Specification::FeatureDescription> *pRVar17;
  RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer> *this_01;
  Arena *pAVar18;
  int iVar19;
  Model m1;
  Result res;
  Model local_80;
  Result local_50;
  
  CoreML::Specification::Model::Model(&local_80,(Arena *)0x0,false);
  if (local_80.description_ == (ModelDescription *)0x0) {
    pAVar18 = (Arena *)(local_80.super_MessageLite._internal_metadata_.ptr_ & 0xfffffffffffffffc);
    if ((local_80.super_MessageLite._internal_metadata_.ptr_ & 1U) != 0) {
      pAVar18 = *(Arena **)pAVar18;
    }
    local_80.description_ =
         google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::ModelDescription>
                   (pAVar18);
  }
  pRVar2 = ((local_80.description_)->input_).super_RepeatedPtrFieldBase.rep_;
  if (pRVar2 == (Rep *)0x0) {
LAB_001722fb:
    pRVar17 = &(local_80.description_)->input_;
    pFVar7 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::FeatureDescription>
                       ((pRVar17->super_RepeatedPtrFieldBase).arena_);
    pvVar11 = google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                        (&pRVar17->super_RepeatedPtrFieldBase,pFVar7);
  }
  else {
    iVar19 = ((local_80.description_)->input_).super_RepeatedPtrFieldBase.current_size_;
    if (pRVar2->allocated_size <= iVar19) goto LAB_001722fb;
    ((local_80.description_)->input_).super_RepeatedPtrFieldBase.current_size_ = iVar19 + 1;
    pvVar11 = pRVar2->elements[iVar19];
  }
  puVar16 = (undefined8 *)(*(ulong *)((long)pvVar11 + 8) & 0xfffffffffffffffc);
  if ((*(ulong *)((long)pvVar11 + 8) & 1) != 0) {
    puVar16 = (undefined8 *)*puVar16;
  }
  google::protobuf::internal::ArenaStringPtr::
  Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>
            ((ArenaStringPtr *)((long)pvVar11 + 0x10),"input",puVar16);
  pFVar5 = *(FeatureType **)((long)pvVar11 + 0x20);
  if (pFVar5 == (FeatureType *)0x0) {
    pAVar18 = (Arena *)(*(ulong *)((long)pvVar11 + 8) & 0xfffffffffffffffc);
    if ((*(ulong *)((long)pvVar11 + 8) & 1) != 0) {
      pAVar18 = *(Arena **)pAVar18;
    }
    pFVar5 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::FeatureType>
                       (pAVar18);
    *(FeatureType **)((long)pvVar11 + 0x20) = pFVar5;
  }
  if (pFVar5->_oneof_case_[0] == 5) {
    pAVar8 = (pFVar5->Type_).multiarraytype_;
  }
  else {
    CoreML::Specification::FeatureType::clear_Type(pFVar5);
    pFVar5->_oneof_case_[0] = 5;
    uVar3 = (pFVar5->super_MessageLite)._internal_metadata_.ptr_;
    pAVar18 = (Arena *)(uVar3 & 0xfffffffffffffffc);
    if ((uVar3 & 1) != 0) {
      pAVar18 = *(Arena **)pAVar18;
    }
    pAVar8 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::ArrayFeatureType>
                       (pAVar18);
    (pFVar5->Type_).multiarraytype_ = pAVar8;
  }
  this = &pAVar8->shape_;
  uVar1 = (pAVar8->shape_).current_size_;
  if (uVar1 == (pAVar8->shape_).total_size_) {
    google::protobuf::RepeatedField<long>::Reserve(this,uVar1 + 1);
    plVar6 = google::protobuf::RepeatedField<long>::elements(this);
    plVar6[uVar1] = 1;
  }
  else {
    plVar6 = google::protobuf::RepeatedField<long>::elements(this);
    plVar6[uVar1] = 1;
  }
  this->current_size_ = uVar1 + 1;
  if (local_80.description_ == (ModelDescription *)0x0) {
    pAVar18 = (Arena *)(local_80.super_MessageLite._internal_metadata_.ptr_ & 0xfffffffffffffffc);
    if ((local_80.super_MessageLite._internal_metadata_.ptr_ & 1U) != 0) {
      pAVar18 = *(Arena **)pAVar18;
    }
    local_80.description_ =
         google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::ModelDescription>
                   (pAVar18);
  }
  pRVar2 = ((local_80.description_)->output_).super_RepeatedPtrFieldBase.rep_;
  if (pRVar2 == (Rep *)0x0) {
LAB_00172426:
    pRVar17 = &(local_80.description_)->output_;
    pFVar7 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::FeatureDescription>
                       ((pRVar17->super_RepeatedPtrFieldBase).arena_);
    pvVar11 = google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                        (&pRVar17->super_RepeatedPtrFieldBase,pFVar7);
  }
  else {
    iVar19 = ((local_80.description_)->output_).super_RepeatedPtrFieldBase.current_size_;
    if (pRVar2->allocated_size <= iVar19) goto LAB_00172426;
    ((local_80.description_)->output_).super_RepeatedPtrFieldBase.current_size_ = iVar19 + 1;
    pvVar11 = pRVar2->elements[iVar19];
  }
  puVar16 = (undefined8 *)(*(ulong *)((long)pvVar11 + 8) & 0xfffffffffffffffc);
  if ((*(ulong *)((long)pvVar11 + 8) & 1) != 0) {
    puVar16 = (undefined8 *)*puVar16;
  }
  google::protobuf::internal::ArenaStringPtr::
  Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>
            ((ArenaStringPtr *)((long)pvVar11 + 0x10),"probs",puVar16);
  pFVar5 = *(FeatureType **)((long)pvVar11 + 0x20);
  if (pFVar5 == (FeatureType *)0x0) {
    pAVar18 = (Arena *)(*(ulong *)((long)pvVar11 + 8) & 0xfffffffffffffffc);
    if ((*(ulong *)((long)pvVar11 + 8) & 1) != 0) {
      pAVar18 = *(Arena **)pAVar18;
    }
    pFVar5 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::FeatureType>
                       (pAVar18);
    *(FeatureType **)((long)pvVar11 + 0x20) = pFVar5;
  }
  if (pFVar5->_oneof_case_[0] != 5) {
    CoreML::Specification::FeatureType::clear_Type(pFVar5);
    pFVar5->_oneof_case_[0] = 5;
    uVar3 = (pFVar5->super_MessageLite)._internal_metadata_.ptr_;
    pAVar18 = (Arena *)(uVar3 & 0xfffffffffffffffc);
    if ((uVar3 & 1) != 0) {
      pAVar18 = *(Arena **)pAVar18;
    }
    pAVar8 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::ArrayFeatureType>
                       (pAVar18);
    (pFVar5->Type_).multiarraytype_ = pAVar8;
  }
  if (local_80._oneof_case_[0] != 500) {
    CoreML::Specification::Model::clear_Type(&local_80);
    local_80._oneof_case_[0] = 500;
    pAVar18 = (Arena *)(local_80.super_MessageLite._internal_metadata_.ptr_ & 0xfffffffffffffffc);
    if ((local_80.super_MessageLite._internal_metadata_.ptr_ & 1U) != 0) {
      pAVar18 = *(Arena **)pAVar18;
    }
    local_80.Type_.neuralnetwork_ =
         google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::NeuralNetwork>(pAVar18);
  }
  pRVar2 = (((RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer> *)
            &(local_80.Type_.pipeline_)->models_)->super_RepeatedPtrFieldBase).rep_;
  if (pRVar2 == (Rep *)0x0) {
LAB_00172520:
    this_01 = (RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer> *)
              &(local_80.Type_.pipeline_)->models_;
    pNVar9 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::NeuralNetworkLayer>
                       ((this_01->super_RepeatedPtrFieldBase).arena_);
    pNVar9 = (NeuralNetworkLayer *)
             google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                       ((RepeatedPtrFieldBase *)this_01,pNVar9);
  }
  else {
    iVar19 = (local_80.Type_.treeensembleregressor_)->postevaluationtransform_;
    if (pRVar2->allocated_size <= iVar19) goto LAB_00172520;
    (local_80.Type_.treeensembleregressor_)->postevaluationtransform_ = iVar19 + 1;
    pNVar9 = (NeuralNetworkLayer *)pRVar2->elements[iVar19];
  }
  pRVar2 = (pNVar9->input_).super_RepeatedPtrFieldBase.rep_;
  if (pRVar2 == (Rep *)0x0) {
LAB_00172558:
    pbVar10 = google::protobuf::Arena::Create<std::__cxx11::string>
                        ((pNVar9->input_).super_RepeatedPtrFieldBase.arena_);
    pvVar11 = google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                        (&(pNVar9->input_).super_RepeatedPtrFieldBase,pbVar10);
  }
  else {
    iVar19 = (pNVar9->input_).super_RepeatedPtrFieldBase.current_size_;
    if (pRVar2->allocated_size <= iVar19) goto LAB_00172558;
    (pNVar9->input_).super_RepeatedPtrFieldBase.current_size_ = iVar19 + 1;
    pvVar11 = pRVar2->elements[iVar19];
  }
  std::__cxx11::string::_M_replace((ulong)pvVar11,0,*(char **)((long)pvVar11 + 8),0x3a8ef3);
  pRVar2 = (pNVar9->output_).super_RepeatedPtrFieldBase.rep_;
  if (pRVar2 != (Rep *)0x0) {
    iVar19 = (pNVar9->output_).super_RepeatedPtrFieldBase.current_size_;
    if (iVar19 < pRVar2->allocated_size) {
      (pNVar9->output_).super_RepeatedPtrFieldBase.current_size_ = iVar19 + 1;
      pvVar11 = pRVar2->elements[iVar19];
      goto LAB_001725c2;
    }
  }
  pbVar10 = google::protobuf::Arena::Create<std::__cxx11::string>
                      ((pNVar9->output_).super_RepeatedPtrFieldBase.arena_);
  pvVar11 = google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                      (&(pNVar9->output_).super_RepeatedPtrFieldBase,pbVar10);
LAB_001725c2:
  std::__cxx11::string::_M_replace((ulong)pvVar11,0,*(char **)((long)pvVar11 + 8),0x3977ad);
  if (pNVar9->_oneof_case_[0] == 0x96) {
    LVar12 = pNVar9->layer_;
  }
  else {
    CoreML::Specification::NeuralNetworkLayer::clear_layer(pNVar9);
    pNVar9->_oneof_case_[0] = 0x96;
    uVar3 = (pNVar9->super_MessageLite)._internal_metadata_.ptr_;
    pAVar18 = (Arena *)(uVar3 & 0xfffffffffffffffc);
    if ((uVar3 & 1) != 0) {
      pAVar18 = *(Arena **)pAVar18;
    }
    LVar12.embedding_ =
         google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::EmbeddingLayerParams>
                   (pAVar18);
    (pNVar9->layer_).embedding_ = (EmbeddingLayerParams *)LVar12;
  }
  (LVar12.innerproduct_)->inputchannels_ = 5;
  (LVar12.innerproduct_)->outputchannels_ = 3;
  (LVar12.innerproduct_)->hasbias_ = true;
  iVar19 = 0xf;
  do {
    pWVar13 = (WeightParams *)((LVar12.activation_)->NonlinearityType_).relu_;
    if (pWVar13 == (WeightParams *)0x0) {
      uVar3 = ((LVar12.convolution_)->super_MessageLite)._internal_metadata_.ptr_;
      pAVar18 = (Arena *)(uVar3 & 0xfffffffffffffffc);
      if ((uVar3 & 1) != 0) {
        pAVar18 = *(Arena **)pAVar18;
      }
      pWVar13 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::WeightParams>
                          (pAVar18);
      ((LVar12.activation_)->NonlinearityType_).relu_ = (ActivationReLU *)pWVar13;
    }
    this_00 = &pWVar13->floatvalue_;
    uVar1 = (pWVar13->floatvalue_).current_size_;
    if (uVar1 == (pWVar13->floatvalue_).total_size_) {
      google::protobuf::RepeatedField<float>::Reserve(this_00,uVar1 + 1);
      pfVar14 = google::protobuf::RepeatedField<float>::elements(this_00);
      pfVar14[uVar1] = 1.0;
    }
    else {
      pfVar14 = google::protobuf::RepeatedField<float>::elements(this_00);
      pfVar14[uVar1] = 1.0;
    }
    this_00->current_size_ = uVar1 + 1;
    iVar19 = iVar19 + -1;
  } while (iVar19 != 0);
  CoreML::validate<(MLModelType)500>(&local_50,&local_80);
  bVar4 = CoreML::Result::good(&local_50);
  if (bVar4) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
               ,0x68);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
    poVar15 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0xade);
    std::__ostream_insert<char,std::char_traits<char>>(poVar15,": error: ",9);
    std::__ostream_insert<char,std::char_traits<char>>(poVar15,"!((res).good())",0xf);
    std::__ostream_insert<char,std::char_traits<char>>(poVar15," was false, expected true.",0x1a);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar15 + -0x18) + (char)poVar15);
    std::ostream::put((char)poVar15);
    std::ostream::flush();
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50.m_message._M_dataplus._M_p != &local_50.m_message.field_2) {
    operator_delete(local_50.m_message._M_dataplus._M_p,
                    local_50.m_message.field_2._M_allocated_capacity + 1);
  }
  CoreML::Specification::Model::~Model(&local_80);
  return (uint)bVar4;
}

Assistant:

int testInvalidEmbeddingBias() {

    Specification::Model m1;

    int num_inputs = 5;
    int num_outputs = 3;

    auto *topIn = m1.mutable_description()->add_input();
    topIn->set_name("input");
    auto *shape = topIn->mutable_type()->mutable_multiarraytype();
    shape->add_shape(1);

    auto *out3 = m1.mutable_description()->add_output();
    out3->set_name("probs");
    out3->mutable_type()->mutable_multiarraytype();

    const auto nn = m1.mutable_neuralnetwork();

    Specification::NeuralNetworkLayer *embeddingLayer = nn->add_layers();
    embeddingLayer->add_input("input");
    embeddingLayer->add_output("probs");
    auto *params = embeddingLayer->mutable_embedding();
    params->set_inputdim(num_inputs);
    params->set_outputchannels(num_outputs);

    params->set_hasbias(true);

    for (int i = 0; i < num_inputs * num_outputs; i++) {
        params->mutable_weights()->add_floatvalue(1.0);
    }

    // Not specifying the right number of bias weights should be invalid

    Result res = validate<MLModelType_neuralNetwork>(m1);
    ML_ASSERT_BAD(res);
    return 0;
}